

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O0

bool __thiscall QMakeParser::readFile(QMakeParser *this,int id,ParseFlags flags,QString *contents)

{
  ReadResult RVar1;
  Int IVar2;
  QString *in_RCX;
  undefined4 in_ESI;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  ReadResult result;
  QString errStr;
  undefined4 in_stack_ffffffffffffff18;
  ParseFlag in_stack_ffffffffffffff1c;
  QString *in_stack_ffffffffffffff20;
  undefined8 *puVar4;
  undefined4 in_stack_ffffffffffffff28;
  undefined2 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff48;
  bool local_a1;
  undefined1 local_a0 [48];
  storage_type *local_70;
  undefined1 local_60 [24];
  undefined1 local_48 [28];
  QFlagsStorageHelper<QMakeParser::ParseFlag,_4> local_2c;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x30ea45);
  RVar1 = QMakeVfs::readFile((QMakeVfs *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             (int)((ulong)in_RDI >> 0x20),
                             (QString *)
                             CONCAT17(in_stack_ffffffffffffff2f,
                                      CONCAT16(in_stack_ffffffffffffff2e,
                                               CONCAT24(in_stack_ffffffffffffff2c,
                                                        in_stack_ffffffffffffff28))),
                             in_stack_ffffffffffffff20);
  if (RVar1 == ReadOk) {
    local_a1 = true;
  }
  else {
    uVar5 = false;
    if (in_RDI[6].m_size != 0) {
      local_2c.super_QFlagsStorage<QMakeParser::ParseFlag>.i =
           (QFlagsStorage<QMakeParser::ParseFlag>)
           QFlags<QMakeParser::ParseFlag>::operator&
                     ((QFlags<QMakeParser::ParseFlag> *)in_stack_ffffffffffffff20,
                      in_stack_ffffffffffffff1c);
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
      in_stack_ffffffffffffff2e = IVar2 != 0 || RVar1 != ReadNotFound;
      uVar5 = in_stack_ffffffffffffff2e;
    }
    if ((bool)uVar5 != false) {
      puVar4 = (undefined8 *)in_RDI[6].m_size;
      QByteArrayView::QByteArrayView<19ul>
                (in_RDI,(char (*) [19])
                        CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffff2e,
                                                CONCAT24(in_stack_ffffffffffffff2c,
                                                         in_stack_ffffffffffffff28))));
      QVar3.m_data = local_70;
      QVar3.m_size = (qsizetype)local_60;
      QString::fromLatin1(QVar3);
      QMakeVfs::fileNameForId
                ((QMakeVfs *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 CONCAT13(uVar5,CONCAT12(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2c)));
      QString::arg<QString,QString&>
                ((QString *)CONCAT44(in_ESI,in_stack_ffffffffffffff48),in_RCX,
                 (QString *)CONCAT44(RVar1,in_stack_ffffffffffffff38));
      QString::QString((QString *)0x30eb55);
      (**(code **)*puVar4)(puVar4,0x300,local_48,local_a0,0);
      QString::~QString((QString *)0x30eb7e);
      QString::~QString((QString *)0x30eb8b);
      QString::~QString((QString *)0x30eb95);
      QString::~QString((QString *)0x30eba2);
    }
    local_a1 = false;
  }
  QString::~QString((QString *)0x30ebcb);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_a1;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeParser::readFile(int id, ParseFlags flags, QString *contents)
{
    QString errStr;
    QMakeVfs::ReadResult result = m_vfs->readFile(id, contents, &errStr);
    if (result != QMakeVfs::ReadOk) {
        if (m_handler && ((flags & ParseReportMissing) || result != QMakeVfs::ReadNotFound))
            m_handler->message(QMakeParserHandler::ParserIoError,
                               fL1S("Cannot read %1: %2").arg(m_vfs->fileNameForId(id), errStr));
        return false;
    }
    return true;
}